

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O0

Integer __thiscall calculator::ExpressionTree::calcValue(ExpressionTree *this,node *x,Tag tag)

{
  SyntaxError *this_00;
  NegateTypeException *this_01;
  allocator<char> local_49;
  string local_48;
  Tag local_24;
  node *pnStack_20;
  Tag tag_local;
  node *x_local;
  ExpressionTree *this_local;
  
  local_24 = tag;
  pnStack_20 = x;
  x_local = (node *)this;
  if (x == (node *)0x0) {
    this_00 = (SyntaxError *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"need one operator numbers",&local_49);
    SyntaxError::SyntaxError(this_00,&local_48);
    __cxa_throw(this_00,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
  }
  if (tag == Not) {
    this_local = (ExpressionTree *)(ulong)(((long)x->value != 0 ^ 0xffU) & 1);
  }
  else if (tag == Negate) {
    if (x->type != Number) {
      this_01 = (NegateTypeException *)__cxa_allocate_exception(0x28);
      NegateTypeException::NegateTypeException(this_01,pnStack_20->value);
      __cxa_throw(this_01,&NegateTypeException::typeinfo,NegateTypeException::~NegateTypeException);
    }
    this_local = (ExpressionTree *)((long)x->value ^ 0xffffffffffffffff);
  }
  else {
    this_local = (ExpressionTree *)0x0;
  }
  return (Integer)this_local;
}

Assistant:

Integer ExpressionTree::calcValue(node *x, Tag tag) {
    if (x == nullptr) throw SyntaxError("need one operator numbers");
    switch (tag) {
        case Tag::Not:
            return (Integer) !((Integer)x->value);
        case Tag::Negate:
            if (x->type != Tag::Number) {
                throw NegateTypeException(x->value);
            }
            return ~((Integer)x->value);
        default:
            break;
    }
    return 0;
}